

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotUndoMove(Fifteen *this)

{
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<char16_t> local_40;
  tuple<Move,_unsigned_long,_unsigned_long> local_28;
  
  Controller::undoMove
            (&local_28,
             (this->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  if (local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_Move,_false>._M_head_impl == NOT_ALLOWED) {
    QString::QString((QString *)&local_40,"");
    QString::QString((QString *)&QStack_58,"There are no moves\t");
    QMessageBox::information(this,&local_40,&QStack_58,0x400,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  else {
    makeMove(this,local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
                  super__Head_base<0UL,_Move,_false>._M_head_impl,
             local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
             super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,
             (size_t)local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
                     super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
                     super__Tuple_impl<2UL,_unsigned_long>.
                     super__Head_base<2UL,_unsigned_long,_false>._M_head_impl);
  }
  return;
}

Assistant:

void Fifteen::slotUndoMove()
{
    auto [ move, row, col ] = controller->undoMove();
    if ( move == Move::NOT_ALLOWED )
    {
        QMessageBox::information( this, "", "There are no moves\t" );
        return;
    }

    makeMove( move, row, col );
}